

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O3

IPGMContext * __thiscall
r_exec::IPGMContext::operator*(IPGMContext *__return_storage_ptr__,IPGMContext *this)

{
  Overlay **ppOVar1;
  PGMOverlay *pPVar2;
  Overlay *pOVar3;
  undefined2 uVar4;
  Data DVar5;
  char cVar6;
  bool bVar7;
  byte bVar8;
  uint16_t uVar9;
  ushort uVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Code *pCVar12;
  View *pVVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  _func_int **pp_Var14;
  undefined4 extraout_var_05;
  Atom *pAVar15;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  ushort unaff_BP;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  IPGMContext parent;
  Atom a;
  uint16_t unused_index;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  IPGMContext local_c0;
  IPGMContext local_90;
  IPGMContext local_60;
  
  cVar6 = r_code::Atom::getDescriptor();
  switch(cVar6) {
  case -0x7c:
    pAVar15 = (this->super__Context).code;
    pCVar12 = this->object;
    pVVar13 = this->view;
    local_c0.super__Context.index = r_code::Atom::asIndex();
    local_c0.super__Context.overlay = (this->super__Context).overlay;
    local_c0.super__Context.data = (this->super__Context).data;
    local_c0.super__Context.code = pAVar15;
    local_c0.object = pCVar12;
    local_c0.view = pVVar13;
    break;
  case -0x7b:
    pCVar12 = this->object;
    uVar10 = r_code::Atom::asIndex();
    iVar11 = (*(pCVar12->super__Object)._vptr__Object[9])(pCVar12,(ulong)uVar10);
    pCVar12 = (Code *)CONCAT44(extraout_var_04,iVar11);
    pp_Var14 = (pCVar12->super__Object)._vptr__Object;
    goto LAB_0015cb01;
  case -0x7a:
    pAVar15 = (this->super__Context).code;
    uVar10 = r_code::Atom::asIndex();
    local_90.super__Context._vptr__Context =
         (_func_int **)
         CONCAT44(local_90.super__Context._vptr__Context._4_4_,
                  *(undefined4 *)(pAVar15 + (ulong)uVar10 * 4));
    cVar6 = r_code::Atom::getDescriptor();
    if (cVar6 == -0x7c) {
      pAVar15 = (this->super__Context).code;
      unaff_BP = r_code::Atom::asIndex();
      r_code::Atom::operator=((Atom *)&local_90,pAVar15 + (ulong)unaff_BP * 4);
    }
    cVar6 = r_code::Atom::isStructural();
    if (cVar6 == '\0') {
      pCVar12 = this->object;
      pVVar13 = this->view;
      pAVar15 = (this->super__Context).code;
      local_c0.super__Context.index = r_code::Atom::asIndex();
      local_c0.super__Context.overlay = (this->super__Context).overlay;
      local_c0.super__Context.data = (this->super__Context).data;
      local_c0.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be4a0;
      local_c0.super__Context.code = pAVar15;
      local_c0.object = pCVar12;
      local_c0.view = pVVar13;
      operator*(__return_storage_ptr__,&local_c0);
    }
    else {
      local_c0.super__Context.data = (this->super__Context).data;
      local_c0.super__Context.overlay = (this->super__Context).overlay;
      local_c0.super__Context.code = (this->super__Context).code;
      local_c0.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be4a0;
      local_c0.object = this->object;
      local_c0.view = this->view;
      local_c0.super__Context.index = unaff_BP;
      bVar7 = evaluate_no_dereference(&local_c0,(uint16_t *)&local_60);
      ppOVar1 = &(__return_storage_ptr__->super__Context).overlay;
      if (bVar7) {
        (__return_storage_ptr__->super__Context).index = local_c0.super__Context.index;
        *(undefined2 *)&(__return_storage_ptr__->super__Context).field_0x1a =
             local_c0.super__Context._26_2_;
        (__return_storage_ptr__->super__Context).data = local_c0.super__Context.data;
        *ppOVar1 = local_c0.super__Context.overlay;
        (__return_storage_ptr__->super__Context).code = local_c0.super__Context.code;
        uVar16 = local_c0.object._0_4_;
        uVar17 = local_c0.object._4_4_;
        uVar18 = local_c0.view._0_4_;
        uVar19 = local_c0.view._4_4_;
      }
      else {
        uVar16 = 0;
        uVar17 = 0;
        uVar18 = 0;
        uVar19 = 0;
        *ppOVar1 = (Overlay *)0x0;
        (__return_storage_ptr__->super__Context).code = (Atom *)0x0;
        (__return_storage_ptr__->super__Context).index = 0;
        (__return_storage_ptr__->super__Context).data = UNDEFINED;
      }
      *(undefined4 *)&__return_storage_ptr__->object = uVar16;
      *(undefined4 *)((long)&__return_storage_ptr__->object + 4) = uVar17;
      *(undefined4 *)&__return_storage_ptr__->view = uVar18;
      *(undefined4 *)((long)&__return_storage_ptr__->view + 4) = uVar19;
      (__return_storage_ptr__->super__Context)._vptr__Context =
           (_func_int **)&PTR___Context_001be4a0;
    }
    r_code::Atom::~Atom((Atom *)&local_90);
    return __return_storage_ptr__;
  case -0x79:
    pCVar12 = (Code *)(((this->super__Context).overlay)->controller->view->object).object;
    uVar9 = r_code::Atom::asIndex();
    iVar11 = (*(pCVar12->super__Object)._vptr__Object[4])(pCVar12,0);
    local_c0.super__Context.overlay = (Overlay *)0x0;
    local_c0.super__Context.data = REFERENCE;
    local_c0.view = (View *)0x0;
    local_c0.super__Context.code = (Atom *)CONCAT44(extraout_var_02,iVar11);
    local_c0.super__Context.index = uVar9;
    local_c0.object = pCVar12;
    break;
  case -0x78:
    pPVar2 = (PGMOverlay *)(this->super__Context).overlay;
    bVar8 = r_code::Atom::asInputIndex();
    pCVar12 = PGMOverlay::getInputObject(pPVar2,(ushort)bVar8);
    pPVar2 = (PGMOverlay *)(this->super__Context).overlay;
    bVar8 = r_code::Atom::asInputIndex();
    pVVar13 = (View *)PGMOverlay::getInputView(pPVar2,(ushort)bVar8);
    iVar11 = (*(pCVar12->super__Object)._vptr__Object[4])(pCVar12,0);
    local_c0.super__Context.index = r_code::Atom::asIndex();
    local_c0.super__Context.overlay = (Overlay *)0x0;
    local_c0.super__Context.data = REFERENCE;
    local_c0.super__Context.code = (Atom *)CONCAT44(extraout_var_01,iVar11);
    local_c0.object = pCVar12;
    local_c0.view = pVVar13;
    break;
  case -0x77:
    pCVar12 = this->object;
    pVVar13 = this->view;
    pAVar15 = r_code::vector<r_code::Atom>::operator[](&((this->super__Context).overlay)->values,0);
    uVar9 = r_code::Atom::asIndex();
    (__return_storage_ptr__->super__Context).overlay = (this->super__Context).overlay;
    (__return_storage_ptr__->super__Context).code = pAVar15;
    (__return_storage_ptr__->super__Context).index = uVar9;
    (__return_storage_ptr__->super__Context).data = VALUE_ARRAY;
    (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001be4a0;
    local_d8 = SUB84(pCVar12,0);
    uStack_d4 = (undefined4)((ulong)pCVar12 >> 0x20);
    uStack_d0 = SUB84(pVVar13,0);
    uStack_cc = (undefined4)((ulong)pVVar13 >> 0x20);
    local_c0.object._0_4_ = local_d8;
    local_c0.object._4_4_ = uStack_d4;
    local_c0.view._0_4_ = uStack_d0;
    local_c0.view._4_4_ = uStack_cc;
    goto LAB_0015cc8b;
  case -0x76:
    pOVar3 = (this->super__Context).overlay;
    uVar10 = r_code::Atom::asIndex();
    pCVar12 = (Code *)pOVar3[1].super__Object._vptr__Object[uVar10];
    pp_Var14 = (pCVar12->super__Object)._vptr__Object;
LAB_0015cb01:
    iVar11 = (*pp_Var14[4])(pCVar12,0);
    (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
    (__return_storage_ptr__->super__Context).code = (Atom *)CONCAT44(extraout_var_05,iVar11);
    (__return_storage_ptr__->super__Context).index = 0;
    (__return_storage_ptr__->super__Context).data = REFERENCE;
LAB_0015cb21:
    (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001be4a0;
    __return_storage_ptr__->object = pCVar12;
    __return_storage_ptr__->view = (View *)0x0;
    return __return_storage_ptr__;
  case -0x75:
  case -0x73:
  case -0x72:
  case -0x71:
    goto switchD_0015c6d9_caseD_8b;
  case -0x74:
    pAVar15 = (this->super__Context).code;
    pCVar12 = this->object;
    pVVar13 = this->view;
    bVar8 = r_code::Atom::asRelativeIndex();
    local_90.super__Context.overlay = (this->super__Context).overlay;
    local_90.super__Context.data = (this->super__Context).data;
    local_90.super__Context.index = (uint16_t)bVar8;
    local_90.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be4a0;
    local_90.super__Context.code = pAVar15;
    local_90.object = pCVar12;
    local_90.view = pVVar13;
    operator*(&local_c0,&local_90);
    iVar11 = (*((local_c0.object)->super__Object)._vptr__Object[4])(local_c0.object,0);
    local_90.super__Context.index = r_code::Atom::asIndex();
    local_90.super__Context.overlay = (Overlay *)0x0;
    local_90.super__Context.data = REFERENCE;
    local_90.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be4a0;
    local_90.object = local_c0.object;
    local_90.view = (View *)0x0;
    local_90.super__Context.code = (Atom *)CONCAT44(extraout_var_06,iVar11);
    operator*(__return_storage_ptr__,&local_90);
    return __return_storage_ptr__;
  case -0x70:
    pVVar13 = (View *)((this->super__Context).overlay)->controller->view;
    pCVar12 = (Code *)(pVVar13->super_View).object.object;
    iVar11 = (*(pCVar12->super__Object)._vptr__Object[4])(pCVar12,0);
    (__return_storage_ptr__->super__Context).overlay = (this->super__Context).overlay;
    (__return_storage_ptr__->super__Context).code = (Atom *)CONCAT44(extraout_var_00,iVar11);
    (__return_storage_ptr__->super__Context).index = 0;
    (__return_storage_ptr__->super__Context).data = REFERENCE;
    (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001be4a0;
    __return_storage_ptr__->object = pCVar12;
    __return_storage_ptr__->view = pVVar13;
    return __return_storage_ptr__;
  case -0x6f:
    pOVar3 = (this->super__Context).overlay;
    if ((pOVar3 != (Overlay *)0x0) &&
       (pCVar12 = this->object, pCVar12 == (Code *)(pOVar3->controller->view->object).object)) {
      pVVar13 = this->view;
      (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
      (__return_storage_ptr__->super__Context).code = (Atom *)&(pVVar13->super_View).field_0x28;
      (__return_storage_ptr__->super__Context).index = 0;
      (__return_storage_ptr__->super__Context).data = VIEW;
      (__return_storage_ptr__->super__Context)._vptr__Context =
           (_func_int **)&PTR___Context_001be4a0;
      __return_storage_ptr__->object = pCVar12;
LAB_0015cdd8:
      __return_storage_ptr__->view = pVVar13;
      return __return_storage_ptr__;
    }
    uVar4 = *(undefined2 *)&(this->super__Context).field_0x1a;
    DVar5 = (this->super__Context).data;
    (__return_storage_ptr__->super__Context).index = (this->super__Context).index;
    *(undefined2 *)&(__return_storage_ptr__->super__Context).field_0x1a = uVar4;
    (__return_storage_ptr__->super__Context).data = DVar5;
    uVar16 = *(undefined4 *)&(this->super__Context).overlay;
    uVar17 = *(undefined4 *)((long)&(this->super__Context).overlay + 4);
    uVar18 = *(undefined4 *)&(this->super__Context).code;
    uVar19 = *(undefined4 *)((long)&(this->super__Context).code + 4);
    goto LAB_0015cc74;
  case -0x6e:
    pCVar12 = this->object;
    iVar11 = (*(pCVar12->super__Object)._vptr__Object[4])(pCVar12,0);
    (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
    (__return_storage_ptr__->super__Context).code = (Atom *)CONCAT44(extraout_var_03,iVar11);
    (__return_storage_ptr__->super__Context).index = 0;
    (__return_storage_ptr__->super__Context).data = MKS;
    goto LAB_0015cb21;
  case -0x6d:
    pCVar12 = this->object;
    iVar11 = (*(pCVar12->super__Object)._vptr__Object[4])(pCVar12,0);
    (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
    (__return_storage_ptr__->super__Context).code = (Atom *)CONCAT44(extraout_var,iVar11);
    (__return_storage_ptr__->super__Context).index = 0;
    (__return_storage_ptr__->super__Context).data = VWS;
    goto LAB_0015cb21;
  default:
    if (cVar6 == -0x40) {
      getChild(&local_90,this,1);
      operator*(&local_c0,&local_90);
      for (uVar10 = 2; iVar11 = (*(this->super__Context)._vptr__Context[6])(this),
          uVar10 <= (ushort)iVar11; uVar10 = uVar10 + 1) {
        cVar6 = r_code::Atom::getDescriptor();
        pCVar12 = local_c0.object;
        if (cVar6 != -0x6f) {
          if (cVar6 == -0x6e) {
            iVar11 = (*((local_c0.object)->super__Object)._vptr__Object[4])(local_c0.object,0);
            (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
            (__return_storage_ptr__->super__Context).code = (Atom *)CONCAT44(extraout_var_07,iVar11)
            ;
            (__return_storage_ptr__->super__Context).index = 0;
            (__return_storage_ptr__->super__Context).data = MKS;
          }
          else {
            if (cVar6 != -0x6d) {
              uVar9 = r_code::Atom::asIndex();
              getChild(&local_60,&local_c0,uVar9);
              operator*(&local_90,&local_60);
              local_c0.object = local_90.object;
              local_c0.view = local_90.view;
              local_c0.super__Context.code = local_90.super__Context.code;
              local_c0.super__Context.index = local_90.super__Context.index;
              local_c0.super__Context.data = local_90.super__Context.data;
              goto LAB_0015c831;
            }
            iVar11 = (*((local_c0.object)->super__Object)._vptr__Object[4])(local_c0.object,0);
            (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
            (__return_storage_ptr__->super__Context).code = (Atom *)CONCAT44(extraout_var_08,iVar11)
            ;
            (__return_storage_ptr__->super__Context).index = 0;
            (__return_storage_ptr__->super__Context).data = VWS;
          }
          pVVar13 = (View *)0x0;
          (__return_storage_ptr__->super__Context)._vptr__Context =
               (_func_int **)&PTR___Context_001be4a0;
          __return_storage_ptr__->object = pCVar12;
          goto LAB_0015cdd8;
        }
        if (local_c0.view == (View *)0x0) {
          local_c0.object._0_4_ = 0;
          local_c0.object._4_4_ = 0;
          local_c0.view._0_4_ = 0;
          local_c0.view._4_4_ = 0;
          (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
          (__return_storage_ptr__->super__Context).code = (Atom *)0x0;
          (__return_storage_ptr__->super__Context).index = 0;
          (__return_storage_ptr__->super__Context).data = UNDEFINED;
          (__return_storage_ptr__->super__Context)._vptr__Context =
               (_func_int **)&PTR___Context_001be4a0;
          goto LAB_0015cc8b;
        }
        local_c0.super__Context.code = (Atom *)&((local_c0.view)->super_View).field_0x28;
        local_c0.super__Context.index = 0;
        local_c0.super__Context.data = VIEW;
LAB_0015c831:
      }
      (__return_storage_ptr__->super__Context).index = local_c0.super__Context.index;
      *(undefined2 *)&(__return_storage_ptr__->super__Context).field_0x1a =
           local_c0.super__Context._26_2_;
      (__return_storage_ptr__->super__Context).data = local_c0.super__Context.data;
      (__return_storage_ptr__->super__Context).overlay = local_c0.super__Context.overlay;
      (__return_storage_ptr__->super__Context).code = local_c0.super__Context.code;
      (__return_storage_ptr__->super__Context)._vptr__Context =
           (_func_int **)&PTR___Context_001be4a0;
      goto LAB_0015cc8b;
    }
    goto switchD_0015c6d9_caseD_8b;
  }
  local_c0.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be4a0;
  operator*(__return_storage_ptr__,&local_c0);
  return __return_storage_ptr__;
switchD_0015c6d9_caseD_8b:
  uVar4 = *(undefined2 *)&(this->super__Context).field_0x1a;
  DVar5 = (this->super__Context).data;
  (__return_storage_ptr__->super__Context).index = (this->super__Context).index;
  *(undefined2 *)&(__return_storage_ptr__->super__Context).field_0x1a = uVar4;
  (__return_storage_ptr__->super__Context).data = DVar5;
  uVar16 = *(undefined4 *)&(this->super__Context).overlay;
  uVar17 = *(undefined4 *)((long)&(this->super__Context).overlay + 4);
  uVar18 = *(undefined4 *)&(this->super__Context).code;
  uVar19 = *(undefined4 *)((long)&(this->super__Context).code + 4);
LAB_0015cc74:
  *(undefined4 *)&(__return_storage_ptr__->super__Context).overlay = uVar16;
  *(undefined4 *)((long)&(__return_storage_ptr__->super__Context).overlay + 4) = uVar17;
  *(undefined4 *)&(__return_storage_ptr__->super__Context).code = uVar18;
  *(undefined4 *)((long)&(__return_storage_ptr__->super__Context).code + 4) = uVar19;
  (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001be4a0;
  local_c0.object._0_4_ = *(undefined4 *)&this->object;
  local_c0.object._4_4_ = *(undefined4 *)((long)&this->object + 4);
  local_c0.view._0_4_ = *(undefined4 *)&this->view;
  local_c0.view._4_4_ = *(undefined4 *)((long)&this->view + 4);
LAB_0015cc8b:
  *(undefined4 *)&__return_storage_ptr__->object = local_c0.object._0_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->object + 4) = local_c0.object._4_4_;
  *(undefined4 *)&__return_storage_ptr__->view = local_c0.view._0_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->view + 4) = local_c0.view._4_4_;
  return __return_storage_ptr__;
}

Assistant:

IPGMContext IPGMContext::operator *() const
{
    switch ((*this)[0].getDescriptor()) {
    case Atom::VL_PTR: { // evaluate the code if necessary.
        // TODO: OPTIMIZATION: if not in a cptr and if this eventually points to an r-ptr or in-obj-ptr,
        // patch the code at this->index, i.e. replace the vl ptr by the in-obj-ptr or rptr.
        Atom a = code[(*this)[0].asIndex()];
        uint16_t structure_index;

        if (a.getDescriptor() == Atom::I_PTR) { // dereference once.
            a = code[structure_index = a.asIndex()];
        }

        if (a.isStructural()) { // the target location is not evaluated yet.
            IPGMContext s(object, view, code, structure_index, (InputLessPGMOverlay *)overlay, data);
            uint16_t unused_index;

            if (s.evaluate_no_dereference(unused_index)) {
                return s;    // patched code: atom at VL_PTR's index changed to VALUE_PTR or 32 bits result.
            } else { // evaluation failed, return undefined context.
                return IPGMContext();
            }
        } else {
            return *IPGMContext(object, view, code, (*this)[0].asIndex(), (InputLessPGMOverlay *)overlay, data);
        }
    }

    case Atom::I_PTR:
        return *IPGMContext(object, view, code, (*this)[0].asIndex(), (InputLessPGMOverlay *)overlay, data);

    case Atom::R_PTR: {
        Code *o = object->get_reference((*this)[0].asIndex());
        return IPGMContext(o, nullptr, &o->code(0), 0, nullptr, REFERENCE);
    }

    case Atom::C_PTR: {
        IPGMContext c = *getChild(1);

        for (uint16_t i = 2; i <= getChildrenCount(); ++i) {
            switch ((*this)[i].getDescriptor()) {
            case Atom::VIEW: // accessible only for this and input objects.
                if (c.view) {
                    c = IPGMContext(c.getObject(), c.view, &c.view->code(0), 0, nullptr, VIEW);
                } else {
                    return IPGMContext();
                }

                break;

            case Atom::MKS:
                return IPGMContext(c.getObject(), MKS);
                break;

            case Atom::VWS:
                return IPGMContext(c.getObject(), VWS);
                break;

            default:
                c = *c.getChild((*this)[i].asIndex());
            }
        }

        return c;
    }

    case Atom::THIS: // refers to the ipgm; the pgm view is not available.
        return IPGMContext(overlay->getObject(), overlay->getView(), &overlay->getObject()->code(0), 0, (InputLessPGMOverlay *)overlay, REFERENCE);

    case Atom::VIEW: // never a reference, always in a cptr.
        if (overlay && object == overlay->getObject()) {
            return IPGMContext(object, view, &view->code(0), 0, nullptr, VIEW);
        }

        return *this;

    case Atom::MKS:
        return IPGMContext(object, MKS);

    case Atom::VWS:
        return IPGMContext(object, VWS);

    case Atom::VALUE_PTR:
        return IPGMContext(object, view, &overlay->values[0], (*this)[0].asIndex(), (InputLessPGMOverlay *)overlay, VALUE_ARRAY);

    case Atom::IPGM_PTR:
        return *IPGMContext(overlay->getObject(), (*this)[0].asIndex());

    case Atom::IN_OBJ_PTR: {
        Code *input_object = ((PGMOverlay *)overlay)->getInputObject((*this)[0].asInputIndex());
        View *input_view = (r_exec::View*)((PGMOverlay *)overlay)->getInputView((*this)[0].asInputIndex());
        return *IPGMContext(input_object, input_view, &input_object->code(0), (*this)[0].asIndex(), nullptr, REFERENCE);
    }

    case Atom::D_IN_OBJ_PTR: {
        IPGMContext parent = *IPGMContext(object, view, code, (*this)[0].asRelativeIndex(), (InputLessPGMOverlay *)overlay, data);
        Code *parent_object = parent.object;
        return *IPGMContext(parent_object, nullptr, &parent_object->code(0), (*this)[0].asIndex(), nullptr, REFERENCE);
    }

    case Atom::PROD_PTR:
        return IPGMContext(((InputLessPGMOverlay *)overlay)->productions[(*this)[0].asIndex()], 0);

    default:
        return *this;
    }
}